

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::deleteTrack(MidiFile *this,int aTrack)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3;
  iVar4 = (int)uVar5;
  if (((iVar4 != 1) && (-1 < aTrack)) && (aTrack < iVar4)) {
    uVar3 = (ulong)(uint)aTrack;
    this_00 = ppMVar1[uVar3];
    if (this_00 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(this_00);
    }
    operator_delete(this_00);
    uVar2 = iVar4 - 1;
    if (aTrack < (int)uVar2) {
      do {
        ppMVar1 = (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppMVar1[uVar3] = ppMVar1[uVar3 + 1];
        aTrack = aTrack + 1;
        uVar3 = uVar3 + 1;
      } while (aTrack < (int)uVar2);
    }
    (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5 & 0xffffffff] = (MidiEventList *)0x0;
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,(ulong)uVar2);
    return;
  }
  return;
}

Assistant:

void MidiFile::splitTracks(void) {
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	int length = m_events[0]->size();
	for (i=0; i<length; i++) {
		if ((*m_events[0])[i].track > maxTrack) {
			maxTrack = (*m_events[0])[i].track;
		}
	}
	int m_trackCount = maxTrack + 1;

	if (m_trackCount <= 1) {
		return;
	}

	MidiEventList* olddata = m_events[0];
	m_events[0] = NULL;
	m_events.resize(m_trackCount);
	for (i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = (*olddata)[i].track;
		m_events[trackValue]->push_back_no_copy(&(*olddata)[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}